

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.hpp
# Opt level: O1

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::Statistics::Statistics(Statistics *this,TYPE ttype)

{
  cpp_dec_float<50U,_int,_void> *pcVar1;
  Timer *pTVar2;
  
  (this->sumDualDegen).m_backend.fpclass = cpp_dec_float_finite;
  (this->sumDualDegen).m_backend.prec_elem = 10;
  (this->sumDualDegen).m_backend.data._M_elems[0] = 0;
  (this->sumDualDegen).m_backend.data._M_elems[1] = 0;
  pcVar1 = &(this->sumDualDegen).m_backend;
  (pcVar1->data)._M_elems[2] = 0;
  (pcVar1->data)._M_elems[3] = 0;
  pcVar1 = &(this->sumDualDegen).m_backend;
  (pcVar1->data)._M_elems[4] = 0;
  (pcVar1->data)._M_elems[5] = 0;
  pcVar1 = &(this->sumDualDegen).m_backend;
  (pcVar1->data)._M_elems[6] = 0;
  (pcVar1->data)._M_elems[7] = 0;
  *(undefined8 *)((long)(this->sumDualDegen).m_backend.data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(this->sumDualDegen).m_backend.data._M_elems + 0x25) = 0;
  (this->sumPrimalDegen).m_backend.fpclass = cpp_dec_float_finite;
  (this->sumPrimalDegen).m_backend.prec_elem = 10;
  (this->sumPrimalDegen).m_backend.data._M_elems[0] = 0;
  (this->sumPrimalDegen).m_backend.data._M_elems[1] = 0;
  pcVar1 = &(this->sumPrimalDegen).m_backend;
  (pcVar1->data)._M_elems[2] = 0;
  (pcVar1->data)._M_elems[3] = 0;
  pcVar1 = &(this->sumPrimalDegen).m_backend;
  (pcVar1->data)._M_elems[4] = 0;
  (pcVar1->data)._M_elems[5] = 0;
  pcVar1 = &(this->sumPrimalDegen).m_backend;
  (pcVar1->data)._M_elems[6] = 0;
  (pcVar1->data)._M_elems[7] = 0;
  *(undefined8 *)((long)(this->sumPrimalDegen).m_backend.data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(this->sumPrimalDegen).m_backend.data._M_elems + 0x25) = 0;
  (this->totalBoundViol).m_backend.fpclass = cpp_dec_float_finite;
  (this->totalBoundViol).m_backend.prec_elem = 10;
  (this->totalBoundViol).m_backend.data._M_elems[0] = 0;
  (this->totalBoundViol).m_backend.data._M_elems[1] = 0;
  pcVar1 = &(this->totalBoundViol).m_backend;
  (pcVar1->data)._M_elems[2] = 0;
  (pcVar1->data)._M_elems[3] = 0;
  pcVar1 = &(this->totalBoundViol).m_backend;
  (pcVar1->data)._M_elems[4] = 0;
  (pcVar1->data)._M_elems[5] = 0;
  pcVar1 = &(this->totalBoundViol).m_backend;
  (pcVar1->data)._M_elems[6] = 0;
  (pcVar1->data)._M_elems[7] = 0;
  *(undefined8 *)((long)(this->totalBoundViol).m_backend.data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(this->totalBoundViol).m_backend.data._M_elems + 0x25) = 0;
  (this->totalRowViol).m_backend.fpclass = cpp_dec_float_finite;
  (this->totalRowViol).m_backend.prec_elem = 10;
  *(undefined8 *)((long)(this->totalRowViol).m_backend.data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(this->totalRowViol).m_backend.data._M_elems + 0x25) = 0;
  pcVar1 = &(this->totalRowViol).m_backend;
  (pcVar1->data)._M_elems[4] = 0;
  (pcVar1->data)._M_elems[5] = 0;
  pcVar1 = &(this->totalRowViol).m_backend;
  (pcVar1->data)._M_elems[6] = 0;
  (pcVar1->data)._M_elems[7] = 0;
  (this->totalRowViol).m_backend.data._M_elems[0] = 0;
  (this->totalRowViol).m_backend.data._M_elems[1] = 0;
  pcVar1 = &(this->totalRowViol).m_backend;
  (pcVar1->data)._M_elems[2] = 0;
  (pcVar1->data)._M_elems[3] = 0;
  (this->maxBoundViol).m_backend.fpclass = cpp_dec_float_finite;
  (this->maxBoundViol).m_backend.data._M_elems[0] = 0;
  (this->maxBoundViol).m_backend.data._M_elems[1] = 0;
  pcVar1 = &(this->maxBoundViol).m_backend;
  (pcVar1->data)._M_elems[2] = 0;
  (pcVar1->data)._M_elems[3] = 0;
  pcVar1 = &(this->maxBoundViol).m_backend;
  (pcVar1->data)._M_elems[4] = 0;
  (pcVar1->data)._M_elems[5] = 0;
  pcVar1 = &(this->maxBoundViol).m_backend;
  (pcVar1->data)._M_elems[6] = 0;
  (pcVar1->data)._M_elems[7] = 0;
  *(undefined8 *)((long)(this->maxBoundViol).m_backend.data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(this->maxBoundViol).m_backend.data._M_elems + 0x25) = 0;
  (this->maxBoundViol).m_backend.prec_elem = 10;
  (this->maxRowViol).m_backend.fpclass = cpp_dec_float_finite;
  (this->maxRowViol).m_backend.prec_elem = 10;
  (this->maxRowViol).m_backend.data._M_elems[0] = 0;
  (this->maxRowViol).m_backend.data._M_elems[1] = 0;
  pcVar1 = &(this->maxRowViol).m_backend;
  (pcVar1->data)._M_elems[2] = 0;
  (pcVar1->data)._M_elems[3] = 0;
  pcVar1 = &(this->maxRowViol).m_backend;
  (pcVar1->data)._M_elems[4] = 0;
  (pcVar1->data)._M_elems[5] = 0;
  pcVar1 = &(this->maxRowViol).m_backend;
  (pcVar1->data)._M_elems[6] = 0;
  (pcVar1->data)._M_elems[7] = 0;
  *(undefined8 *)((long)(this->maxRowViol).m_backend.data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(this->maxRowViol).m_backend.data._M_elems + 0x25) = 0;
  (this->finalCompObj).m_backend.fpclass = cpp_dec_float_finite;
  (this->finalCompObj).m_backend.prec_elem = 10;
  (this->finalCompObj).m_backend.data._M_elems[0] = 0;
  (this->finalCompObj).m_backend.data._M_elems[1] = 0;
  pcVar1 = &(this->finalCompObj).m_backend;
  (pcVar1->data)._M_elems[2] = 0;
  (pcVar1->data)._M_elems[3] = 0;
  pcVar1 = &(this->finalCompObj).m_backend;
  (pcVar1->data)._M_elems[4] = 0;
  (pcVar1->data)._M_elems[5] = 0;
  pcVar1 = &(this->finalCompObj).m_backend;
  (pcVar1->data)._M_elems[6] = 0;
  (pcVar1->data)._M_elems[7] = 0;
  *(undefined8 *)((long)(this->finalCompObj).m_backend.data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(this->finalCompObj).m_backend.data._M_elems + 0x25) = 0;
  (this->finalBasisCondition).m_backend.fpclass = cpp_dec_float_finite;
  (this->finalBasisCondition).m_backend.prec_elem = 10;
  (this->finalBasisCondition).m_backend.data._M_elems[0] = 0;
  (this->finalBasisCondition).m_backend.data._M_elems[1] = 0;
  pcVar1 = &(this->finalBasisCondition).m_backend;
  (pcVar1->data)._M_elems[2] = 0;
  (pcVar1->data)._M_elems[3] = 0;
  pcVar1 = &(this->finalBasisCondition).m_backend;
  (pcVar1->data)._M_elems[4] = 0;
  (pcVar1->data)._M_elems[5] = 0;
  pcVar1 = &(this->finalBasisCondition).m_backend;
  (pcVar1->data)._M_elems[6] = 0;
  (pcVar1->data)._M_elems[7] = 0;
  *(undefined8 *)((long)(this->finalBasisCondition).m_backend.data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(this->finalBasisCondition).m_backend.data._M_elems + 0x25) = 0;
  this->timerType = ttype;
  pTVar2 = TimerFactory::createTimer(ttype);
  this->readingTime = pTVar2;
  pTVar2 = TimerFactory::createTimer(this->timerType);
  this->solvingTime = pTVar2;
  pTVar2 = TimerFactory::createTimer(this->timerType);
  this->preprocessingTime = pTVar2;
  pTVar2 = TimerFactory::createTimer(this->timerType);
  this->simplexTime = pTVar2;
  pTVar2 = TimerFactory::createTimer(this->timerType);
  this->syncTime = pTVar2;
  pTVar2 = TimerFactory::createTimer(this->timerType);
  this->transformTime = pTVar2;
  pTVar2 = TimerFactory::createTimer(this->timerType);
  this->rationalTime = pTVar2;
  pTVar2 = TimerFactory::createTimer(this->timerType);
  this->initialPrecisionTime = pTVar2;
  pTVar2 = TimerFactory::createTimer(this->timerType);
  this->extendedPrecisionTime = pTVar2;
  pTVar2 = TimerFactory::createTimer(this->timerType);
  this->reconstructionTime = pTVar2;
  pTVar2 = TimerFactory::createTimer(this->timerType);
  this->boostingStepTime = pTVar2;
  (*this->readingTime->_vptr_Timer[2])();
  clearSolvingData(this);
  return;
}

Assistant:

SoPlexBase<R>::Statistics::Statistics(Timer::TYPE ttype)
{
   timerType = ttype;
   readingTime = TimerFactory::createTimer(timerType);
   solvingTime = TimerFactory::createTimer(timerType);
   preprocessingTime = TimerFactory::createTimer(timerType);
   simplexTime = TimerFactory::createTimer(timerType);
   syncTime = TimerFactory::createTimer(timerType);
   transformTime = TimerFactory::createTimer(timerType);
   rationalTime = TimerFactory::createTimer(timerType);
   initialPrecisionTime = TimerFactory::createTimer(timerType);
   extendedPrecisionTime = TimerFactory::createTimer(timerType);
   reconstructionTime = TimerFactory::createTimer(timerType);
   boostingStepTime = TimerFactory::createTimer(timerType);
   clearAllData();
}